

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QCalendarWidget::setSelectedDate(QCalendarWidget *this,QDate date)

{
  QCalendarWidgetPrivate *this_00;
  undefined8 uVar1;
  int year;
  int month;
  QDate QVar2;
  QCalendarModel *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  pQVar3 = this_00->m_model;
  if ((pQVar3->m_date).jd == date.jd) {
    local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::currentIndex(&local_58,(QAbstractItemView *)this_00->m_view);
    QVar2 = QtPrivate::QCalendarModel::dateForCell(this_00->m_model,local_58.r,local_58.c);
    if ((0x16d3e147973 < date.jd + 0xb69eeff91fU) || (QVar2.jd == date.jd)) goto LAB_003cc14f;
    pQVar3 = this_00->m_model;
  }
  else if (0x16d3e147973 < date.jd + 0xb69eeff91fU) goto LAB_003cc14f;
  (pQVar3->m_date).jd = date.jd;
  lVar4 = (pQVar3->m_minimumDate).jd;
  if ((date.jd < lVar4) || (lVar4 = (pQVar3->m_maximumDate).jd, lVar4 < date.jd)) {
    (pQVar3->m_date).jd = lVar4;
  }
  QCalendarWidgetPrivate::update(this_00);
  local_58._0_8_ = (this_00->m_model->m_date).jd;
  uVar1 = *(undefined8 *)&this_00->m_model->m_calendar;
  year = QDate::year(&local_58,uVar1);
  month = QDate::month(&local_58,uVar1);
  QCalendarWidgetPrivate::showMonth(this_00,year,month);
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
LAB_003cc14f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidget::setSelectedDate(QDate date)
{
    Q_D(QCalendarWidget);
    if (d->m_model->m_date == date && date == d->getCurrentDate())
        return;

    if (!date.isValid())
        return;

    d->m_model->setDate(date);
    d->update();
    QDate newDate = d->m_model->m_date;
    QCalendar cal = d->m_model->m_calendar;
    d->showMonth(newDate.year(cal), newDate.month(cal));
    emit selectionChanged();
}